

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint64_t uVar101;
  uint64_t uVar102;
  uint64_t uVar103;
  uint64_t uVar104;
  int iVar105;
  int iVar106;
  secp256k1_gej *psVar107;
  ulong uVar108;
  secp256k1_gej *a_00;
  secp256k1_fe *a_01;
  ulong uVar109;
  secp256k1_gej *psVar110;
  secp256k1_gej *psVar111;
  ulong uVar112;
  secp256k1_gej *psVar113;
  ulong uVar114;
  ulong uVar115;
  ulong unaff_R13;
  
  secp256k1_fe_verify(a);
  psVar110 = (secp256k1_gej *)0x8;
  psVar111 = (secp256k1_gej *)a;
  secp256k1_fe_verify_magnitude(a,8);
  uVar115 = a->n[0];
  if (uVar115 >> 0x38 == 0) {
    psVar111 = (secp256k1_gej *)a->n[1];
    if ((secp256k1_gej *)0xffffffffffffff < psVar111) goto LAB_00115922;
    uVar108 = a->n[2];
    if (0xffffffffffffff < uVar108) goto LAB_00115927;
    uVar109 = a->n[3];
    if (0xffffffffffffff < uVar109) goto LAB_0011592c;
    uVar112 = a->n[4];
    if (uVar112 >> 0x34 != 0) goto LAB_00115931;
    uVar114 = uVar115 * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar109;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar114;
    psVar110 = (secp256k1_gej *)((long)psVar111 * 2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar108;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = psVar110;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar112;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar112;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar6 * auVar58,0);
    auVar4 = auVar5 * auVar57 + auVar4 * auVar56 + auVar7 * ZEXT816(0x1000003d10);
    unaff_R13 = auVar4._8_8_;
    if (unaff_R13 >> 0x33 != 0) goto LAB_00115936;
    auVar100 = auVar4 >> 0x34;
    psVar113 = auVar100._0_8_;
    uVar112 = uVar112 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar112;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar115;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar109;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = psVar110;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar108;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar108;
    auVar5 = auVar8 * auVar59 + auVar10 * auVar61 + auVar9 * auVar60;
    if (0x7ffffffffffff < SUB168(auVar5 + (auVar4 >> 0x34),8)) goto LAB_0011593b;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(auVar6 * auVar58,8);
    auVar5 = auVar11 * ZEXT816(0x1000003d10000) + auVar5 + (auVar4 >> 0x34);
    psVar110 = SUB168(auVar5 >> 0x34,8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar112;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = psVar111;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar109;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar108 * 2;
    auVar6 = auVar13 * auVar63 + auVar12 * auVar62 + (auVar5 >> 0x34);
    if (auVar6._8_8_ >> 0x32 != 0) goto LAB_00115940;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar115;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar115;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
    auVar7 = auVar15 * ZEXT816(0x1000003d1) + auVar14 * auVar64;
    psVar113 = (secp256k1_gej *)(auVar7._0_8_ & 0xfffffffffffff);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar112;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar108;
    r->n[0] = (uint64_t)psVar113;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar109;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar109;
    psVar110 = (secp256k1_gej *)0x3ffffffffffff;
    auVar6 = auVar17 * auVar66 + auVar16 * auVar65 + (auVar6 >> 0x34);
    if (0x3ffffffffffff < auVar6._8_8_) goto LAB_00115945;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = psVar111;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar114;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar7 = auVar19 * ZEXT816(0x1000003d10) + auVar18 * auVar67 + (auVar7 >> 0x34);
    psVar113 = psVar111;
    if (0x7ffffffffffff < auVar7._8_8_) goto LAB_0011594a;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar108;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar114;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = psVar111;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = psVar111;
    auVar56 = auVar21 * auVar69 + auVar20 * auVar68;
    uVar115 = SUB168(auVar56 + (auVar7 >> 0x34),8);
    r->n[1] = auVar7._0_8_ & 0xfffffffffffff;
    psVar110 = (secp256k1_gej *)(0x3ffffffffffff - uVar115);
    if (0x3ffffffffffff < uVar115) goto LAB_0011594f;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar112;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar109;
    auVar6 = auVar22 * auVar70 + (auVar6 >> 0x34);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar6._0_8_;
    auVar7 = auVar23 * ZEXT816(0x1000003d10) + auVar56 + (auVar7 >> 0x34);
    r->n[2] = auVar7._0_8_ & 0xfffffffffffff;
    auVar7 = auVar7 >> 0x34;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auVar7._0_8_;
    psVar110 = auVar7._8_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar6._8_8_;
    auVar96._8_8_ = psVar110;
    auVar96._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
    auVar97 = auVar24 * ZEXT816(0x1000003d10000) + auVar96 + auVar97;
    uVar115 = auVar97._0_8_;
    uVar108 = auVar97._8_8_;
    if (uVar108 >> 0x24 != 0) goto LAB_00115954;
    r->n[3] = uVar115 & 0xfffffffffffff;
    uVar115 = (uVar108 << 0xc | uVar115 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
    r->n[4] = uVar115;
    if (uVar115 >> 0x31 == 0) {
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    secp256k1_fe_sqr_cold_13();
LAB_00115922:
    secp256k1_fe_sqr_cold_12();
LAB_00115927:
    secp256k1_fe_sqr_cold_11();
LAB_0011592c:
    secp256k1_fe_sqr_cold_10();
LAB_00115931:
    secp256k1_fe_sqr_cold_9();
LAB_00115936:
    secp256k1_fe_sqr_cold_8();
    auVar100._8_8_ = unaff_R13;
    auVar100._0_8_ = psVar111;
LAB_0011593b:
    psVar113 = auVar100._0_8_;
    secp256k1_fe_sqr_cold_7();
LAB_00115940:
    secp256k1_fe_sqr_cold_6();
LAB_00115945:
    secp256k1_fe_sqr_cold_5();
LAB_0011594a:
    r = &psVar113->x;
    secp256k1_fe_sqr_cold_4();
LAB_0011594f:
    secp256k1_fe_sqr_cold_3();
LAB_00115954:
    secp256k1_fe_sqr_cold_2();
  }
  secp256k1_fe_sqr_cold_1();
  secp256k1_fe_verify(&psVar110->x);
  secp256k1_fe_verify(&a_00->x);
  secp256k1_fe_verify_magnitude(&psVar110->x,8);
  psVar111 = (secp256k1_gej *)0x8;
  psVar113 = a_00;
  secp256k1_fe_verify_magnitude(&a_00->x,8);
  if ((secp256k1_gej *)r == a_00) {
    secp256k1_fe_mul_cold_21();
LAB_00115e99:
    secp256k1_fe_mul_cold_20();
LAB_00115e9e:
    secp256k1_fe_mul_cold_19();
LAB_00115ea3:
    secp256k1_fe_mul_cold_18();
LAB_00115ea8:
    secp256k1_fe_mul_cold_17();
LAB_00115ead:
    secp256k1_fe_mul_cold_16();
LAB_00115eb2:
    secp256k1_fe_mul_cold_15();
LAB_00115eb7:
    secp256k1_fe_mul_cold_14();
LAB_00115ebc:
    secp256k1_fe_mul_cold_13();
LAB_00115ec1:
    secp256k1_fe_mul_cold_12();
LAB_00115ec6:
    secp256k1_fe_mul_cold_11();
    psVar110 = psVar111;
    psVar107 = psVar113;
LAB_00115ecb:
    secp256k1_fe_mul_cold_10();
LAB_00115ed0:
    secp256k1_fe_mul_cold_9();
LAB_00115ed5:
    secp256k1_fe_mul_cold_8();
LAB_00115eda:
    r = &psVar107->x;
    secp256k1_fe_mul_cold_7();
LAB_00115edf:
    secp256k1_fe_mul_cold_6();
LAB_00115ee4:
    secp256k1_fe_mul_cold_5();
LAB_00115ee9:
    secp256k1_fe_mul_cold_4();
LAB_00115eee:
    secp256k1_fe_mul_cold_3();
  }
  else {
    if (psVar110 == a_00) goto LAB_00115e99;
    uVar115 = (psVar110->x).n[0];
    if (uVar115 >> 0x38 != 0) goto LAB_00115e9e;
    uVar108 = (psVar110->x).n[1];
    if (0xffffffffffffff < uVar108) goto LAB_00115ea3;
    psVar111 = (secp256k1_gej *)(psVar110->x).n[2];
    if ((secp256k1_gej *)0xffffffffffffff < psVar111) goto LAB_00115ea8;
    uVar109 = (psVar110->x).n[3];
    if (0xffffffffffffff < uVar109) goto LAB_00115ead;
    uVar112 = (psVar110->x).n[4];
    if (uVar112 >> 0x34 != 0) goto LAB_00115eb2;
    uVar114 = (a_00->x).n[0];
    if (0xffffffffffffff < uVar114) goto LAB_00115eb7;
    uVar1 = (a_00->x).n[1];
    if (0xffffffffffffff < uVar1) goto LAB_00115ebc;
    uVar2 = (a_00->x).n[2];
    if (0xffffffffffffff < uVar2) goto LAB_00115ec1;
    psVar113 = (secp256k1_gej *)(a_00->x).n[3];
    if ((secp256k1_gej *)0xffffffffffffff < psVar113) goto LAB_00115ec6;
    uVar3 = (a_00->x).n[4];
    psVar110 = psVar111;
    psVar107 = psVar113;
    if (0xfffffffffffff < uVar3) goto LAB_00115ecb;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = psVar113;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar115;
    psVar107 = SUB168(auVar25 * auVar71,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar2;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar108;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar1;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = psVar111;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar114;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar109;
    auVar4 = auVar25 * auVar71 + auVar26 * auVar72 + auVar28 * auVar74 + auVar27 * auVar73;
    psVar110 = auVar4._8_8_;
    if ((ulong)psVar110 >> 0x32 != 0) goto LAB_00115ed0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar3;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar112;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = SUB168(auVar29 * auVar75,0);
    auVar4 = auVar4 + auVar30 * ZEXT816(0x1000003d10);
    auVar6 = auVar4 >> 0x34;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar3;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar115;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = psVar113;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar108;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar2;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = psVar111;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar1;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar109;
    psVar107 = SUB168(auVar34 * auVar79,8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar114;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar112;
    auVar5 = auVar32 * auVar77 + auVar33 * auVar78 + auVar35 * auVar80 + auVar34 * auVar79;
    auVar7 = auVar31 * auVar76 + auVar5;
    psVar110 = (secp256k1_gej *)
               (auVar7._8_8_ + auVar6._8_8_ + (ulong)CARRY8(auVar7._0_8_,auVar6._0_8_));
    if ((ulong)psVar110 >> 0x33 != 0) goto LAB_00115ed5;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = SUB168(auVar29 * auVar75,8);
    auVar5 = auVar36 * ZEXT816(0x1000003d10000) + auVar6 + auVar5 + auVar31 * auVar76;
    psVar110 = SUB168(auVar5 >> 0x34,0);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar3;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar108;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = psVar113;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = psVar111;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar109;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar1;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar112;
    auVar6 = (auVar5 >> 0x34) +
             auVar38 * auVar82 + auVar40 * auVar84 + auVar39 * auVar83 + auVar37 * auVar81;
    psVar107 = SUB168(auVar38 * auVar82,0);
    if (0x3ffffffffffff < auVar6._8_8_) goto LAB_00115eda;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar114;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar115;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar6._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar5._6_2_ & 0xf);
    auVar7 = auVar41 * auVar85 + auVar42 * ZEXT816(0x1000003d1);
    (((secp256k1_gej *)r)->x).n[0] = auVar7._0_8_ & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar115;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = (a_00->x).n[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar108;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = (a_00->x).n[0];
    auVar7 = auVar43 * auVar86 + (auVar7 >> 0x34) + auVar44 * auVar87;
    psVar110 = auVar7._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < psVar110) goto LAB_00115edf;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = psVar111;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = (a_00->x).n[4];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar109;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = (a_00->x).n[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar112;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = (a_00->x).n[2];
    auVar6 = auVar45 * auVar88 + (auVar6 >> 0x34) + auVar46 * auVar89 + auVar47 * auVar90;
    if (0x3ffffffffffff < auVar6._8_8_) goto LAB_00115ee4;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar7 = auVar7 + auVar48 * ZEXT816(0x1000003d10);
    (((secp256k1_gej *)r)->x).n[1] = auVar7._0_8_ & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar115;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (a_00->x).n[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar108;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = (a_00->x).n[1];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = psVar111;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (a_00->x).n[0];
    auVar7 = auVar50 * auVar92 + auVar49 * auVar91 + (auVar7 >> 0x34) + auVar51 * auVar93;
    psVar110 = auVar7._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < psVar110) goto LAB_00115ee9;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar109;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = (a_00->x).n[4];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar112;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = (a_00->x).n[3];
    auVar6 = auVar52 * auVar94 + (auVar6 >> 0x34) + auVar53 * auVar95;
    uVar115 = auVar6._8_8_;
    if (0x3ffffffffffff < uVar115) goto LAB_00115eee;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auVar6._0_8_;
    auVar7 = auVar7 + auVar54 * ZEXT816(0x1000003d10);
    auVar6 = auVar7 >> 0x34;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auVar6._0_8_;
    (((secp256k1_gej *)r)->x).n[2] = auVar7._0_8_ & 0xfffffffffffff;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar115;
    psVar110 = auVar6._8_8_;
    auVar98._8_8_ = psVar110;
    auVar98._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar99 = auVar55 * ZEXT816(0x1000003d10000) + auVar98 + auVar99;
    uVar115 = auVar99._0_8_;
    uVar108 = auVar99._8_8_;
    if (uVar108 >> 0x24 == 0) {
      (((secp256k1_gej *)r)->x).n[3] = uVar115 & 0xfffffffffffff;
      uVar115 = (uVar108 << 0xc | uVar115 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
      (((secp256k1_gej *)r)->x).n[4] = uVar115;
      if (uVar115 >> 0x31 == 0) {
        (((secp256k1_gej *)r)->x).magnitude = 1;
        (((secp256k1_gej *)r)->x).normalized = 0;
        secp256k1_fe_verify(r);
        return;
      }
      goto LAB_00115ef8;
    }
  }
  secp256k1_fe_mul_cold_2();
LAB_00115ef8:
  secp256k1_fe_mul_cold_1();
  secp256k1_gej_verify(psVar110);
  if (psVar110->infinity == 0) {
    if (a_01 != (secp256k1_fe *)0x0) {
      uVar101 = (psVar110->y).n[0];
      uVar102 = (psVar110->y).n[1];
      uVar103 = (psVar110->y).n[2];
      uVar104 = (psVar110->y).n[3];
      iVar105 = (psVar110->y).magnitude;
      iVar106 = (psVar110->y).normalized;
      a_01->n[4] = (psVar110->y).n[4];
      a_01->magnitude = iVar105;
      a_01->normalized = iVar106;
      a_01->n[2] = uVar103;
      a_01->n[3] = uVar104;
      a_01->n[0] = uVar101;
      a_01->n[1] = uVar102;
      secp256k1_fe_verify(a_01);
      uVar115 = a_01->n[4];
      uVar109 = (uVar115 >> 0x30) * 0x1000003d1 + a_01->n[0];
      uVar108 = (uVar109 >> 0x34) + a_01->n[1];
      uVar112 = (uVar108 >> 0x34) + a_01->n[2];
      uVar114 = (uVar112 >> 0x34) + a_01->n[3];
      a_01->n[0] = uVar109 & 0xfffffffffffff;
      a_01->n[1] = uVar108 & 0xfffffffffffff;
      a_01->n[2] = uVar112 & 0xfffffffffffff;
      a_01->n[3] = uVar114 & 0xfffffffffffff;
      a_01->n[4] = (uVar114 >> 0x34) + (uVar115 & 0xffffffffffff);
      a_01->magnitude = 1;
      secp256k1_fe_verify(a_01);
    }
    secp256k1_gej_double((secp256k1_gej *)r,psVar110);
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  secp256k1_gej_set_infinity((secp256k1_gej *)r);
  if (a_01 != (secp256k1_fe *)0x0) {
    a_01->n[0] = 1;
    a_01->n[1] = 0;
    a_01->n[2] = 0;
    a_01->n[3] = 0;
    a_01->n[4] = 0;
    a_01->magnitude = 1;
    a_01->normalized = 1;
    secp256k1_fe_verify(a_01);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);

    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}